

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O1

void * mi_heap_realloc_zero_aligned_at
                 (mi_heap_t *heap,void *p,size_t newsize,size_t alignment,size_t offset,_Bool zero)

{
  void *pvVar1;
  size_t sVar2;
  long lVar3;
  void *asrc;
  void *adst;
  
  if (alignment < 9) {
    pvVar1 = _mi_heap_realloc_zero(heap,p,newsize,zero);
    return pvVar1;
  }
  if (p == (void *)0x0) {
    pvVar1 = mi_heap_malloc_zero_aligned_at(heap,newsize,alignment,offset,zero);
    return pvVar1;
  }
  sVar2 = mi_usable_size(p);
  if ((((sVar2 < newsize) || (newsize < sVar2 - (sVar2 >> 1))) ||
      (pvVar1 = p, ((long)p + offset) % alignment != 0)) &&
     (pvVar1 = mi_heap_malloc_zero_aligned_at(heap,newsize,alignment,offset,false),
     pvVar1 != (void *)0x0)) {
    if (zero && sVar2 < newsize) {
      lVar3 = sVar2 - 8;
      if (sVar2 < 8) {
        lVar3 = 0;
      }
      memset((void *)((long)pvVar1 + lVar3),0,newsize - lVar3);
    }
    if (sVar2 < newsize) {
      newsize = sVar2;
    }
    memcpy(pvVar1,p,newsize);
    mi_free(p);
  }
  return pvVar1;
}

Assistant:

static void* mi_heap_realloc_zero_aligned_at(mi_heap_t* heap, void* p, size_t newsize, size_t alignment, size_t offset, bool zero) mi_attr_noexcept {
  mi_assert(alignment > 0);
  if (alignment <= sizeof(uintptr_t)) return _mi_heap_realloc_zero(heap,p,newsize,zero);
  if (p == NULL) return mi_heap_malloc_zero_aligned_at(heap,newsize,alignment,offset,zero);
  size_t size = mi_usable_size(p);
  if (newsize <= size && newsize >= (size - (size / 2))
      && (((uintptr_t)p + offset) % alignment) == 0) {
    return p;  // reallocation still fits, is aligned and not more than 50% waste
  }
  else {
    // note: we don't zero allocate upfront so we only zero initialize the expanded part
    void* newp = mi_heap_malloc_aligned_at(heap,newsize,alignment,offset);
    if (newp != NULL) {
      if (zero && newsize > size) {
        // also set last word in the previous allocation to zero to ensure any padding is zero-initialized
        size_t start = (size >= sizeof(intptr_t) ? size - sizeof(intptr_t) : 0);
        _mi_memzero((uint8_t*)newp + start, newsize - start);
      }
      _mi_memcpy_aligned(newp, p, (newsize > size ? size : newsize));
      mi_free(p); // only free if successful
    }
    return newp;
  }
}